

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

WebPDecBuffer * GetOutputBuffer(WebPIDecoder *idec)

{
  WebPIDecoder *idec_local;
  WebPDecBuffer *local_8;
  
  if ((idec == (WebPIDecoder *)0x0) || (idec->dec_ == (void *)0x0)) {
    local_8 = (WebPDecBuffer *)0x0;
  }
  else if (idec->state_ < STATE_VP8_DATA) {
    local_8 = (WebPDecBuffer *)0x0;
  }
  else if (idec->final_output_ == (WebPDecBuffer *)0x0) {
    local_8 = (idec->params_).output;
  }
  else {
    local_8 = (WebPDecBuffer *)0x0;
  }
  return local_8;
}

Assistant:

static const WebPDecBuffer* GetOutputBuffer(const WebPIDecoder* const idec) {
  if (idec == NULL || idec->dec_ == NULL) {
    return NULL;
  }
  if (idec->state_ <= STATE_VP8_PARTS0) {
    return NULL;
  }
  if (idec->final_output_ != NULL) {
    return NULL;   // not yet slow-copied
  }
  return idec->params_.output;
}